

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O0

void __thiscall AtomicFile::impl::write_raw(impl *this,string *content)

{
  string *content_local;
  impl *this_local;
  
  File::write_raw(&this->temp_file,content);
  this->is_temp_active = true;
  return;
}

Assistant:

void AtomicFile::impl::write_raw (const std::string& content)
{
  try
  {
    temp_file.write_raw (content);
    is_temp_active = true;
  }
  catch (...)
  {
    allow_atomics = false;
    throw;
  }
}